

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

ExprNode * __thiscall Parser::atom(Parser *this,Token *tok)

{
  bool bVar1;
  bool *pbVar2;
  WholeNumber *this_00;
  Variable *this_01;
  String *this_02;
  allocator<char> local_2a1;
  string local_2a0;
  allocator<char> local_279;
  string local_278;
  undefined1 local_251;
  Token local_250;
  allocator<char> local_1d9;
  string local_1d8;
  allocator<char> local_1b1;
  string local_1b0;
  undefined1 local_190 [8];
  Token closeParen;
  ExprNode *p;
  Token local_110;
  undefined1 local_9d;
  Token local_90;
  Token *local_20;
  Token *tok_local;
  Parser *this_local;
  
  local_20 = tok;
  tok_local = (Token *)this;
  pbVar2 = Token::isWholeNumber(tok);
  if ((*pbVar2 & 1U) == 0) {
    bVar1 = Token::isName(tok);
    if (bVar1) {
      Tokenizer::ungetToken(this->tokenizer);
      this_01 = (Variable *)operator_new(0x80);
      Token::Token(&local_110,tok);
      Variable::Variable(this_01,&local_110);
      this_local = (Parser *)this_01;
      Token::~Token(&local_110);
    }
    else {
      bVar1 = Token::isOpenParen(tok);
      if (bVar1) {
        closeParen._string.field_2._8_8_ = test(this);
        Tokenizer::getToken((Token *)local_190,this->tokenizer);
        bVar1 = Token::isCloseParen((Token *)local_190);
        if (!bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1b0,"Parser::primary",&local_1b1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1d8,"Expected close-parenthesis, instead got",&local_1d9);
          die(this,&local_1b0,&local_1d8,(Token *)local_190);
          std::__cxx11::string::~string((string *)&local_1d8);
          std::allocator<char>::~allocator(&local_1d9);
          std::__cxx11::string::~string((string *)&local_1b0);
          std::allocator<char>::~allocator(&local_1b1);
        }
        this_local = (Parser *)closeParen._string.field_2._8_8_;
        Token::~Token((Token *)local_190);
      }
      else {
        bVar1 = Token::isString(tok);
        if (bVar1) {
          this_02 = (String *)operator_new(0x80);
          local_251 = 1;
          Token::Token(&local_250,tok);
          String::String(this_02,&local_250);
          local_251 = 0;
          this_local = (Parser *)this_02;
          Token::~Token(&local_250);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_278,"Parser::primary",&local_279);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2a0,"Unexpected token",&local_2a1);
          die(this,&local_278,&local_2a0,tok);
          std::__cxx11::string::~string((string *)&local_2a0);
          std::allocator<char>::~allocator(&local_2a1);
          std::__cxx11::string::~string((string *)&local_278);
          std::allocator<char>::~allocator(&local_279);
          this_local = (Parser *)0x0;
        }
      }
    }
  }
  else {
    this_00 = (WholeNumber *)operator_new(0x80);
    local_9d = 1;
    Token::Token(&local_90,tok);
    WholeNumber::WholeNumber(this_00,&local_90);
    local_9d = 0;
    this_local = (Parser *)this_00;
    Token::~Token(&local_90);
  }
  return (ExprNode *)this_local;
}

Assistant:

ExprNode *Parser::atom(Token tok) {
    // atom: ID | NUMBER | STRING+ | ( test )
    // This function parses the grammar rules:

    // <primary> -> [0-9]+
    // <primary> -> [_a-zA-Z][_a-zA-Z0-9]*
    // <primary> -> (<expr>)

    //Token tok = tokenizer.getToken();
    if (tok.isWholeNumber() )
        return new WholeNumber(tok);
    else if( tok.isName() ) {
        tokenizer.ungetToken();
        //ExprNode * id = variableID();
        return new Variable(tok);;
    }
    else if (tok.isOpenParen()) {
        ExprNode *p = test();
        Token closeParen = tokenizer.getToken();
        if (!closeParen.isCloseParen())
            die("Parser::primary", "Expected close-parenthesis, instead got", closeParen);
        return p;
    } else if(tok.isString())
        return new String(tok);

    die("Parser::primary", "Unexpected token", tok);
    return nullptr;  // Will not reach this statement!
}